

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void liblogger::LogCritical(char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  undefined8 in_R8;
  allocator<char> *in_R9;
  char *in_XMM0_Qa;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_XMM0_Qb;
  string str;
  int res;
  va_list ap;
  char *tmp;
  string *str_00;
  LogType Type;
  undefined1 local_118 [8];
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  char *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  allocator<char> local_51;
  string local_50 [36];
  int local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  string *local_10;
  char *local_8;
  
  if (in_AL != '\0') {
    in_stack_ffffffffffffff18 = in_XMM0_Qa;
    in_stack_ffffffffffffff20 = in_XMM0_Qb;
  }
  local_10 = (string *)0x0;
  local_18 = local_118;
  local_20 = &stack0x00000008;
  local_24 = 0x30;
  local_28 = 8;
  local_110 = in_RSI;
  local_108 = in_RDX;
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_8 = in_RDI;
  local_2c = vasprintf((char **)&local_10,in_RDI,&local_28);
  if (local_2c < 0) {
    abort();
  }
  Type = (LogType)((ulong)&local_51 >> 0x20);
  str_00 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_R9);
  std::allocator<char>::~allocator(&local_51);
  Logger(Type,str_00);
  free(local_10);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void LogCritical(const char *fmt, ...)
{
	char *tmp = 0;

	va_list ap;
	va_start(ap, fmt);
	int res = vasprintf(&tmp, fmt, ap);
	if (res < 0)
		abort();
	std::string str = tmp;
	Logger(LOGGER_CRIT, str);
	free(tmp);
	va_end(ap);
}